

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_re.c
# Opt level: O2

int ks_getuntil2(kstream_t *ks,int delimiter,kstring_t *str,int *dret,int append)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  size_t __size;
  long lVar8;
  bool bVar9;
  long lVar10;
  
  if (dret != (int *)0x0) {
    *dret = 0;
  }
  if (append == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = str->l;
  }
  str->l = sVar2;
  iVar5 = ks->begin;
  iVar1 = ks->end;
  bVar9 = true;
LAB_00104f51:
  if (iVar5 < iVar1) {
LAB_00104f82:
    iVar5 = ks->begin;
    lVar8 = (long)iVar5;
    lVar10 = (long)iVar1;
    iVar7 = iVar1;
    if (iVar1 < iVar5) {
      iVar7 = iVar5;
    }
    if (delimiter == 2) {
      for (; lVar8 < lVar10; lVar8 = lVar8 + 1) {
        if (ks->buf[lVar8] == '\n') goto LAB_00105000;
      }
    }
    else if (delimiter == 0) {
      for (; lVar8 < lVar10; lVar8 = lVar8 + 1) {
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (ulong)ks->buf[lVar8] * 2 + 1) & 0x20) != 0)
        goto LAB_00105000;
      }
    }
    else {
      for (; lVar8 < lVar10; lVar8 = lVar8 + 1) {
        ppuVar3 = __ctype_b_loc();
        if ((ks->buf[lVar8] != 0x20) && (((*ppuVar3)[ks->buf[lVar8]] & 0x2000) != 0))
        goto LAB_00105000;
      }
    }
    goto LAB_00105003;
  }
  if (ks->is_eof == 0) {
    ks->begin = 0;
    iVar1 = gzread(ks->f,ks->buf,0xffff);
    ks->end = iVar1;
    if (iVar1 != 0) goto LAB_00104f82;
    ks->is_eof = 1;
    iVar1 = 0;
  }
  if ((bVar9) && (iVar1 <= ks->begin)) {
    return -1;
  }
  goto LAB_001050e1;
LAB_00105000:
  iVar7 = (int)lVar8;
LAB_00105003:
  sVar2 = str->l;
  iVar1 = iVar7 - iVar5;
  pcVar4 = str->s;
  if (str->m - sVar2 < (ulong)(long)(iVar1 + 1)) {
    uVar6 = sVar2 + (long)iVar1 >> 1 | sVar2 + (long)iVar1;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    __size = (uVar6 >> 0x10 | uVar6) + 1;
    str->m = __size;
    pcVar4 = (char *)realloc(pcVar4,__size);
    str->s = pcVar4;
    sVar2 = str->l;
    iVar5 = ks->begin;
    iVar1 = iVar7 - iVar5;
  }
  memcpy(pcVar4 + sVar2,ks->buf + iVar5,(long)iVar1);
  str->l = str->l + ((long)iVar7 - (long)ks->begin);
  iVar5 = iVar7 + 1;
  ks->begin = iVar5;
  iVar1 = ks->end;
  if ((dret != (int *)0x0) && (iVar7 < iVar1)) {
    *dret = (uint)ks->buf[iVar7];
    goto LAB_001050e1;
  }
  bVar9 = false;
  if (iVar7 < iVar1) {
LAB_001050e1:
    pcVar4 = str->s;
    if (pcVar4 == (char *)0x0) {
      str->m = 1;
      pcVar4 = (char *)calloc(1,1);
      str->s = pcVar4;
      uVar6 = str->l;
    }
    else {
      uVar6 = str->l;
      if ((1 < uVar6 && delimiter == 2) && (pcVar4[uVar6 - 1] == '\r')) {
        uVar6 = uVar6 - 1;
        str->l = uVar6;
      }
    }
    pcVar4[uVar6] = '\0';
    return (int)str->l;
  }
  goto LAB_00104f51;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_re(char *input_file, char *aStrRegex, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* pcre2 variables */
	pcre2_code *re; // the regex object
	PCRE2_SIZE erroroffset;
	int errornumber;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

        if (verbose_flag) {
            if (is_fasta)
                fprintf(stderr, "Input is FASTA format\n");
            else
                fprintf(stderr, "Input is FASTQ format\n");
        }

	/* initialize the re */
	re = pcre2_compile(
			aStrRegex,             /* the pattern */
			PCRE2_ZERO_TERMINATED, /* indicates pattern is zero-terminated */
			0,                     /* default options */
			&errornumber,          /* for error num */
			&erroroffset,          /* err offset */
			NULL);                 /* default compile context */

	if (re == NULL) {
		  PCRE2_UCHAR buffer[256];
		  pcre2_get_error_message(errornumber, buffer, sizeof(buffer));
		  fprintf(stderr, "PCRE2 compilation failed at offset %d: %s\n", (int)erroroffset, buffer);
		  exit(EXIT_FAILURE);
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude) {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s))
				excluded++;
			else {
				/* regex doesn't match, so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			}
		} else {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s)) {
				/* regex matches so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			} else
				excluded++;
		}
	} /* end of seq traversal */

	/* tear down re */
	pcre2_code_free(re); /* free up the re */

	kseq_destroy(seq);
	gzclose(fp); /* done reading file so close */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}